

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O3

void BamTools::Options::
     AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (string *argument,string *valueDescription,string *optionDescription,
               string *valueTypeDescription,bool *foundArgument,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *val,OptionGroup *group)

{
  size_t *psVar1;
  mapped_type *pmVar2;
  Option o;
  Variant local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  bool *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined2 local_b0;
  bool local_ae;
  Variant local_a8;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined2 local_40;
  Variant local_38;
  
  local_a0._0_8_ = local_a0 + 0x10;
  local_a0._8_8_ = 0;
  local_a0[0x10] = '\0';
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40._0_1_ = true;
  local_40._1_1_ = false;
  local_38.data = (ImplBase *)0x0;
  std::__cxx11::string::_M_assign((string *)local_a0);
  std::__cxx11::string::_M_assign((string *)&local_80);
  std::__cxx11::string::_M_assign((string *)&local_60);
  std::vector<BamTools::Option,_std::allocator<BamTools::Option>_>::push_back
            (&group->Options,(value_type *)local_a0);
  local_c8 = 0;
  local_c0[0] = 0;
  local_b0 = 0x100;
  local_ae = false;
  local_a8.data = (ImplBase *)0x0;
  local_e0 = foundArgument;
  pvStack_d8 = val;
  local_d0 = local_c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,val);
  Variant::Variant<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_100,&local_f8);
  if (local_100.data != (ImplBase *)0x0) {
    (local_100.data)->refs = (local_100.data)->refs + 1;
  }
  if (local_a8.data != (ImplBase *)0x0) {
    psVar1 = &(local_a8.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_a8.data)->_vptr_ImplBase[1])(local_a8.data);
    }
  }
  local_a8.data = local_100.data;
  if (local_100.data != (ImplBase *)0x0) {
    psVar1 = &(local_100.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_100.data)->_vptr_ImplBase[1])();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  local_ae = valueTypeDescription->_M_string_length != 0;
  std::__cxx11::string::_M_assign((string *)&local_d0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
           ::operator[](&m_optionsMap_abi_cxx11_,argument);
  pmVar2->pFoundArgument = local_e0;
  pmVar2->pValue = pvStack_d8;
  std::__cxx11::string::_M_assign((string *)&pmVar2->ValueTypeDescription);
  pmVar2->IsRequired = local_ae;
  pmVar2->UseVector = (bool)(undefined1)local_b0;
  pmVar2->StoreValue = (bool)local_b0._1_1_;
  Variant::operator=(&pmVar2->VariantValue,&local_a8);
  if (local_a8.data != (ImplBase *)0x0) {
    psVar1 = &(local_a8.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_a8.data)->_vptr_ImplBase[1])();
    }
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_38.data != (ImplBase *)0x0) {
    psVar1 = &(local_38.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_38.data)->_vptr_ImplBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  return;
}

Assistant:

void Options::AddValueOption(const std::string& argument, const std::string& valueDescription,
                             const std::string& optionDescription,
                             const std::string& valueTypeDescription, bool& foundArgument, T& val,
                             OptionGroup* group)
{
    Option o;
    o.Argument = argument;
    o.ValueDescription = valueDescription;
    o.Description = optionDescription;
    group->Options.push_back(o);

    OptionValue ov;
    ov.pFoundArgument = &foundArgument;
    ov.pValue = (void*)&val;
    ov.VariantValue = val;
    ov.IsRequired = (valueTypeDescription.empty() ? false : true);
    ov.ValueTypeDescription = valueTypeDescription;
    m_optionsMap[argument] = ov;
}